

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O0

vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_> *
wasm::StringifyProcessor::filterOverlaps
          (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           *__return_storage_ptr__,
          vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
          *substrings)

{
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference puVar4;
  Index *pIVar5;
  reference pvVar6;
  reference __x;
  ulong uVar7;
  reference pvVar8;
  RepeatedSubstring local_110;
  uint local_ec;
  int local_e8;
  Index i_2;
  value_type substringIdx;
  int i_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> indices;
  undefined1 local_a8 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  startIndices;
  uint local_88 [4];
  uint local_78;
  uint local_74;
  const_iterator cStack_70;
  uint startIdx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  value_type *substring;
  undefined1 local_48 [4];
  Index i;
  vector<int,_std::allocator<int>_> substringIdxs;
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  *substrings_local;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  *result;
  
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)
             &substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  substring._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
            ::size(substrings);
    if (sVar2 <= substring._4_4_) break;
    pvVar3 = std::
             vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             ::operator[](substrings,(ulong)substring._4_4_);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pvVar3->StartIndices);
    cStack_70 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&pvVar3->StartIndices)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff90);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_74 = *puVar4;
      local_78 = local_74 + pvVar3->Length;
      std::vector<wasm::Interval,std::allocator<wasm::Interval>>::
      emplace_back<unsigned_int&,unsigned_int,unsigned_int_const&>
                ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)
                 &substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_74,&local_78,&pvVar3->Length);
      local_88[0] = substring._4_4_;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_48,(value_type_conflict5 *)local_88);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    substring._4_4_ = substring._4_4_ + 1;
  }
  startIndices.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::vector(__return_storage_ptr__);
  sVar2 = std::
          vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
          ::size(substrings);
  this = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
         ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_a8,sVar2,this);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  IntervalProcessor::filterOverlaps
            ((vector<int,_std::allocator<int>_> *)&__range1,
             (vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)
             &substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  _substringIdx =
       std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &substringIdx);
    if (!bVar1) break;
    pIVar5 = (Index *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end1);
    i_2 = *pIVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)(int)i_2);
    local_e8 = *pvVar6;
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_a8,(long)local_e8);
    __x = std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::operator[]
                    ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)
                     &substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(long)(int)i_2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar8,&__x->start);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  local_ec = 0;
  while( true ) {
    uVar7 = (ulong)local_ec;
    sVar2 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_a8);
    if (sVar2 <= uVar7) break;
    pvVar8 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)local_a8,(ulong)local_ec);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    if (1 < sVar2) {
      pvVar3 = std::
               vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               ::operator[](substrings,(ulong)local_ec);
      local_110.Length = pvVar3->Length;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_a8,(ulong)local_ec);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_110.StartIndices,pvVar8);
      std::
      vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ::emplace_back<wasm::SuffixTree::RepeatedSubstring>(__return_storage_ptr__,&local_110);
      SuffixTree::RepeatedSubstring::~RepeatedSubstring(&local_110);
    }
    local_ec = local_ec + 1;
  }
  startIndices.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_a8);
  if ((startIndices.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
    ::~vector(__return_storage_ptr__);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::~vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)
             &substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SuffixTree::RepeatedSubstring> StringifyProcessor::filterOverlaps(
  const std::vector<SuffixTree::RepeatedSubstring>& substrings) {
  // A substring represents a contiguous set of instructions that appear more
  // than once in a Wasm binary. For each appearance of the substring, an
  // Interval is created that lacks a connection back to its originating
  // substring. To fix, upon Interval creation, a second vector is populated
  // with the index of the corresponding substring.
  std::vector<Interval> intervals;
  std::vector<int> substringIdxs;

  // Construct intervals
  for (Index i = 0; i < substrings.size(); i++) {
    auto& substring = substrings[i];
    for (auto startIdx : substring.StartIndices) {
      intervals.emplace_back(
        startIdx, startIdx + substring.Length, substring.Length);
      substringIdxs.push_back(i);
    }
  }

  // Get the overlapping intervals
  std::vector<SuffixTree::RepeatedSubstring> result;
  std::vector<std::vector<Index>> startIndices(substrings.size());
  std::vector<int> indices = IntervalProcessor::filterOverlaps(intervals);
  for (auto i : indices) {
    // i is the idx of the Interval in the intervals vector
    // i in substringIdxs returns the idx of the substring that needs to be
    // included in result
    auto substringIdx = substringIdxs[i];
    startIndices[substringIdx].push_back(intervals[i].start);
  }
  for (Index i = 0; i < startIndices.size(); i++) {
    if (startIndices[i].size() > 1) {
      result.emplace_back(SuffixTree::RepeatedSubstring(
        {substrings[i].Length, std::move(startIndices[i])}));
    }
  }

  return result;
}